

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O0

void anon_unknown.dwarf_23de0c::PulsePlayback::streamWriteCallbackC
               (pa_stream *stream,size_t nbytes,void *pdata)

{
  size_t in_stack_00000040;
  pa_stream *in_stack_00000048;
  PulsePlayback *in_stack_00000050;
  
  streamWriteCallback(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  return;
}

Assistant:

static void streamWriteCallbackC(pa_stream *stream, size_t nbytes, void *pdata) noexcept
    { static_cast<PulsePlayback*>(pdata)->streamWriteCallback(stream, nbytes); }